

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::getLogLikelihood
          (BeagleCPUImpl<double,_1,_1> *this,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int k;
  int returnCode;
  double *outSumLogLikelihood_local;
  BeagleCPUImpl<double,_1,_1> *this_local;
  
  returnCode = 0;
  *outSumLogLikelihood = 0.0;
  for (k = 0; k < this->kPatternCount; k = k + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->outLogLikelihoodsTmp[k];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->gPatternWeights[k];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *outSumLogLikelihood;
    auVar1 = vfmadd213sd_fma(auVar1,auVar2,auVar3);
    *outSumLogLikelihood = auVar1._0_8_;
  }
  if ((*outSumLogLikelihood != *outSumLogLikelihood) ||
     (NAN(*outSumLogLikelihood) || NAN(*outSumLogLikelihood))) {
    returnCode = -8;
  }
  return returnCode;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getLogLikelihood(double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    *outSumLogLikelihood = 0.0;
    for(int k=0; k < kPatternCount; k++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[k] * gPatternWeights[k];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}